

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsc.c
# Opt level: O3

void dsc_xor_group(Dsc_node_t *pOut,Dsc_node_t *ni,Dsc_node_t *nj,int nVars,int TRUTH_WORDS)

{
  uint *cubeCof;
  uint *cubeCof_00;
  uint *cubeCof_01;
  uint *cubeCof_02;
  uint uVar1;
  word *pwVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  Dsc_node_t *pDVar6;
  char cVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  char *pcVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint *cubeCof_03;
  
  uVar1 = ni->on[0];
  uVar10 = ni->off[0];
  uVar4 = nj->on[0];
  uVar14 = nj->off[0];
  pcVar5 = pOut->exp + 1;
  pOut->exp[0] = '[';
  cVar7 = ni->exp[0];
  if (cVar7 != '\0') {
    pcVar11 = ni->exp;
    do {
      pcVar11 = pcVar11 + 1;
      *pcVar5 = cVar7;
      pcVar5 = pcVar5 + 1;
      cVar7 = *pcVar11;
    } while (cVar7 != '\0');
  }
  cVar7 = nj->exp[0];
  if (cVar7 != '\0') {
    pcVar11 = nj->exp;
    do {
      pcVar11 = pcVar11 + 1;
      *pcVar5 = cVar7;
      pcVar5 = pcVar5 + 1;
      cVar7 = *pcVar11;
    } while (cVar7 != '\0');
  }
  cubeCof = ni->off;
  cubeCof_00 = ni->on;
  cubeCof_01 = nj->off;
  cubeCof_02 = nj->on;
  uVar8 = uVar1;
  if ((int)uVar10 < (int)uVar1) {
    uVar8 = uVar10;
  }
  uVar9 = uVar8;
  if ((int)uVar14 <= (int)uVar8) {
    uVar9 = uVar14;
  }
  pcVar5[0] = ']';
  pcVar5[1] = '\0';
  pDVar6 = nj;
  if ((int)uVar8 <= (int)uVar14) {
    pDVar6 = ni;
  }
  if ((int)uVar4 < (int)uVar9) {
    pDVar6 = nj;
  }
  if (pDVar6 == ni) {
    if ((int)uVar9 <= (int)uVar4 && ((int)uVar14 < (int)uVar8 || (int)uVar10 <= (int)uVar1)) {
      pwVar2 = nj->pNegCof;
      pOut->pNegCof = pwVar2;
      cubeCofactor(pwVar2,cubeCof,TRUTH_WORDS);
      pDVar6 = (Dsc_node_t *)&nj->pPosCof;
      cubeCof_03 = cubeCof;
    }
    else {
      pwVar2 = nj->pPosCof;
      pOut->pNegCof = pwVar2;
      cubeCofactor(pwVar2,cubeCof_00,TRUTH_WORDS);
      pDVar6 = nj;
      cubeCof_03 = cubeCof_00;
    }
  }
  else if ((int)uVar9 <= (int)uVar4 && ((int)uVar14 < (int)uVar8 || (int)uVar10 <= (int)uVar1)) {
    pwVar2 = ni->pNegCof;
    pOut->pNegCof = pwVar2;
    cubeCofactor(pwVar2,cubeCof_01,TRUTH_WORDS);
    pDVar6 = (Dsc_node_t *)&ni->pPosCof;
    cubeCof_03 = cubeCof_01;
  }
  else {
    pwVar2 = ni->pPosCof;
    pOut->pNegCof = pwVar2;
    cubeCofactor(pwVar2,cubeCof_02,TRUTH_WORDS);
    pDVar6 = ni;
    cubeCof_03 = cubeCof_02;
  }
  pwVar2 = pDVar6->pNegCof;
  pOut->pPosCof = pwVar2;
  cubeCofactor(pwVar2,cubeCof_03,TRUTH_WORDS);
  pOut->pBoolDiff = ni->pBoolDiff;
  pOut->off[0] = 0;
  if ((int)(uVar4 + uVar1) < (int)(uVar14 + uVar10)) {
    uVar8 = *cubeCof_00;
    if ((int)uVar8 < 1) {
      uVar9 = 0;
    }
    else {
      uVar12 = 0;
      do {
        pOut->off[uVar12 + 1] = ni->on[uVar12 + 1];
        uVar12 = uVar12 + 1;
      } while (uVar8 != uVar12);
      uVar9 = pOut->off[0];
    }
    uVar13 = uVar8 + uVar9;
    pOut->off[0] = uVar13;
    uVar3 = *cubeCof_02;
    if (0 < (int)uVar3) {
      uVar12 = 0;
      do {
        pOut->off[(int)(uVar8 + uVar9 + 1 + (int)uVar12)] = nj->on[uVar12 + 1];
        uVar12 = uVar12 + 1;
      } while (uVar3 != uVar12);
LAB_00527879:
      uVar13 = pOut->off[0];
    }
  }
  else {
    uVar8 = *cubeCof;
    if ((int)uVar8 < 1) {
      uVar9 = 0;
    }
    else {
      uVar12 = 0;
      do {
        pOut->off[uVar12 + 1] = ni->off[uVar12 + 1];
        uVar12 = uVar12 + 1;
      } while (uVar8 != uVar12);
      uVar9 = pOut->off[0];
    }
    uVar13 = uVar8 + uVar9;
    pOut->off[0] = uVar13;
    uVar3 = *cubeCof_01;
    if (0 < (int)uVar3) {
      uVar12 = 0;
      do {
        pOut->off[(int)(uVar8 + uVar9 + 1 + (int)uVar12)] = nj->off[uVar12 + 1];
        uVar12 = uVar12 + 1;
      } while (uVar3 != uVar12);
      goto LAB_00527879;
    }
  }
  pOut->off[0] = uVar3 + uVar13;
  pOut->on[0] = 0;
  if ((int)(uVar14 + uVar1) < (int)(uVar4 + uVar10)) {
    uVar1 = *cubeCof_00;
    if ((int)uVar1 < 1) {
      uVar10 = 0;
    }
    else {
      uVar12 = 0;
      do {
        pOut->on[uVar12 + 1] = ni->on[uVar12 + 1];
        uVar12 = uVar12 + 1;
      } while (uVar1 != uVar12);
      uVar10 = pOut->on[0];
    }
    uVar14 = uVar1 + uVar10;
    pOut->on[0] = uVar14;
    uVar4 = *cubeCof_01;
    if ((int)uVar4 < 1) goto LAB_00527943;
    uVar12 = 0;
    do {
      pOut->on[(int)(uVar1 + uVar10 + 1 + (int)uVar12)] = nj->off[uVar12 + 1];
      uVar12 = uVar12 + 1;
    } while (uVar4 != uVar12);
  }
  else {
    uVar1 = *cubeCof;
    if ((int)uVar1 < 1) {
      uVar10 = 0;
    }
    else {
      uVar12 = 0;
      do {
        pOut->on[uVar12 + 1] = ni->off[uVar12 + 1];
        uVar12 = uVar12 + 1;
      } while (uVar1 != uVar12);
      uVar10 = pOut->on[0];
    }
    uVar14 = uVar1 + uVar10;
    pOut->on[0] = uVar14;
    uVar4 = *cubeCof_02;
    if ((int)uVar4 < 1) goto LAB_00527943;
    uVar12 = 0;
    do {
      pOut->on[(int)(uVar1 + uVar10 + 1 + (int)uVar12)] = nj->on[uVar12 + 1];
      uVar12 = uVar12 + 1;
    } while (uVar4 != uVar12);
  }
  uVar14 = pOut->on[0];
LAB_00527943:
  pOut->on[0] = uVar4 + uVar14;
  return;
}

Assistant:

void dsc_xor_group(Dsc_node_t * pOut, Dsc_node_t * ni, Dsc_node_t * nj, int nVars, const int TRUTH_WORDS) {
    //
    const unsigned int * xiOFF = ni->off;
    const unsigned int * xiON = ni->on;
    const unsigned int * xjOFF = nj->off;
    const unsigned int * xjON = nj->on;
    //
    const int xiOFFSize = xiOFF[0];
    const int xiONSize = xiON[0];
    const int xjOFFSize = xjOFF[0];
    const int xjONSize = xjON[0];
    // minCubeCofs
    int minCCSize = xiOFFSize;
    int minCCPolarity = 0;
    Dsc_node_t * minCCNode = ni;
    // expression
    concat(pOut->exp, '[', ']', ni->exp, 1, nj->exp, 1);
    if (minCCSize > xiONSize) {
        minCCSize = xiONSize;
        minCCPolarity = 1;
        //minCCNode = ni;
    }
    if (minCCSize > xjOFFSize) {
        minCCSize = xjOFFSize;
        minCCPolarity = 0;
        minCCNode = nj;
    }
    if (minCCSize > xjONSize) {
        minCCSize = xjONSize;
        minCCPolarity = 1;
        minCCNode = nj;
    }
    //
    if (minCCNode == ni) {
        if (minCCPolarity) {
            // gOFF = xiON, xjON
            pOut->pNegCof = nj->pPosCof;
            cubeCofactor(pOut->pNegCof, xiON, TRUTH_WORDS);
            // gON = xiON, xjOFF
            pOut->pPosCof = nj->pNegCof;
            cubeCofactor(pOut->pPosCof, xiON, TRUTH_WORDS);
        } else {
            // gOFF = xiOFF, xjOFF
            pOut->pNegCof = nj->pNegCof;
            cubeCofactor(pOut->pNegCof, xiOFF, TRUTH_WORDS);
            // gON = xiOFF, xjON
            pOut->pPosCof = nj->pPosCof;
            cubeCofactor(pOut->pPosCof, xiOFF, TRUTH_WORDS);
        }
    }else  {
        if (minCCPolarity) {
            // gOFF = xjON, xiON
            pOut->pNegCof = ni->pPosCof;
            cubeCofactor(pOut->pNegCof, xjON, TRUTH_WORDS);
            // gON = xjON, xiOFF
            pOut->pPosCof = ni->pNegCof;
            cubeCofactor(pOut->pPosCof, xjON, TRUTH_WORDS);
        } else {
            // gOFF = xjOFF, xiOFF
            pOut->pNegCof = ni->pNegCof;
            cubeCofactor(pOut->pNegCof, xjOFF, TRUTH_WORDS);
            // gON = xjOFF, xiON
            pOut->pPosCof = ni->pPosCof;
            cubeCofactor(pOut->pPosCof, xjOFF, TRUTH_WORDS);
        }
    }
    // bool diff
    pOut->pBoolDiff = ni->pBoolDiff;
    // evaluating specs
    // off spec
    pOut->off[0] = 0;
    if ((xiOFFSize+xjOFFSize) <= (xiONSize+xjONSize)) {
        merge(pOut->off, xiOFF);
        merge(pOut->off, xjOFF);
    } else {
        merge(pOut->off, xiON);
        merge(pOut->off, xjON);
    }
    // on spec
    pOut->on[0] = 0;
    if ((xiOFFSize+xjONSize) <= (xiONSize+xjOFFSize)) {
        merge(pOut->on, xiOFF);
        merge(pOut->on, xjON);
    } else {
        merge(pOut->on, xiON);
        merge(pOut->on, xjOFF);
    }
}